

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

void ps_search_init(ps_search_t *search,ps_searchfuncs_t *vt,char *type,char *name,
                   ps_config_t *config,acmod_t *acmod,dict_t *dict,dict2pid_t *d2p)

{
  char *pcVar1;
  dict2pid_t *pdVar2;
  dict_t *pdVar3;
  acmod_t *acmod_local;
  ps_config_t *config_local;
  char *name_local;
  char *type_local;
  ps_searchfuncs_t *vt_local;
  ps_search_t *search_local;
  
  search->vt = vt;
  pcVar1 = __ckd_salloc__(name,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                          ,0x627);
  search->name = pcVar1;
  pcVar1 = __ckd_salloc__(type,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                          ,0x628);
  search->type = pcVar1;
  search->config = config;
  search->acmod = acmod;
  if (d2p == (dict2pid_t *)0x0) {
    search->d2p = (dict2pid_t *)0x0;
  }
  else {
    pdVar2 = dict2pid_retain(d2p);
    search->d2p = pdVar2;
  }
  if (dict == (dict_t *)0x0) {
    search->dict = (dict_t *)0x0;
    search->silence_wid = -1;
    search->finish_wid = -1;
    search->start_wid = -1;
    search->n_words = 0;
  }
  else {
    pdVar3 = dict_retain(dict);
    search->dict = pdVar3;
    search->start_wid = dict->startwid;
    search->finish_wid = dict->finishwid;
    search->silence_wid = dict->silwid;
    search->n_words = dict->n_word;
  }
  return;
}

Assistant:

void
ps_search_init(ps_search_t *search, ps_searchfuncs_t *vt,
	       const char *type,
	       const char *name,
               ps_config_t *config, acmod_t *acmod, dict_t *dict,
               dict2pid_t *d2p)
{
    search->vt = vt;
    search->name = ckd_salloc(name);
    search->type = ckd_salloc(type);

    search->config = config;
    search->acmod = acmod;
    if (d2p)
        search->d2p = dict2pid_retain(d2p);
    else
        search->d2p = NULL;
    if (dict) {
        search->dict = dict_retain(dict);
        search->start_wid = dict_startwid(dict);
        search->finish_wid = dict_finishwid(dict);
        search->silence_wid = dict_silwid(dict);
        search->n_words = dict_size(dict);
    }
    else {
        search->dict = NULL;
        search->start_wid = search->finish_wid = search->silence_wid = -1;
        search->n_words = 0;
    }
}